

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3StreamReader.cpp
# Opt level: O2

void __thiscall
AC3StreamReader::writePESExtension(AC3StreamReader *this,PESPacket *pesPacket,AVPacket *avPacket)

{
  byte bVar1;
  byte bVar2;
  
  if (this->m_useNewStyleAudioPES == true) {
    pesPacket->flagsLo = pesPacket->flagsLo | 1;
    bVar1 = pesPacket->m_pesHeaderLen + 9;
    *(undefined2 *)(&pesPacket->startCode0 + bVar1) = 0x8101;
    if (((this->super_AC3Codec).m_true_hd_mode == true) &&
       ((this->super_AC3Codec).m_downconvertToAC3 != true)) {
      bVar2 = ((byte)avPacket->flags & 0x40) >> 4 | 0x72;
    }
    else {
      bVar2 = 0x72 - ((this->super_AC3Codec).m_bsid < 0xb);
    }
    (&pesPacket->startCode2)[bVar1] = bVar2;
    pesPacket->m_pesHeaderLen = pesPacket->m_pesHeaderLen + '\x03';
  }
  return;
}

Assistant:

void AC3StreamReader::writePESExtension(PESPacket* pesPacket, const AVPacket& avPacket)
{
    if (m_useNewStyleAudioPES)
    {
        pesPacket->flagsLo |= 1;  // enable PES extension for AC3 stream
        uint8_t* data = reinterpret_cast<uint8_t*>(pesPacket) + pesPacket->getHeaderLength();
        *data++ = 0x01;
        *data++ = 0x81;
        if (!m_true_hd_mode || m_downconvertToAC3)
        {
            if (m_bsid > 10)
                *data = 0x72;  // E-AC3 subtype
            else
                *data = 0x71;  // AC3 subtype
        }
        else
        {
            if (avPacket.flags & AVPacket::IS_CORE_PACKET)
                *data = 0x76;  // AC3 at TRUE-HD
            else
                *data = 0x72;  // TRUE-HD data
        }
        pesPacket->m_pesHeaderLen += 3;
    }
}